

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat2.c
# Opt level: O3

void quantize_3(float *src,char *dst,int n,int k)

{
  ulong uVar1;
  
  if ((k & 0x3fU) == 0) {
    if (0 < n) {
      uVar1 = (ulong)(uint)n;
      do {
        quantize_3_row(src,dst,k);
        dst = dst + (k >> 4) * 9;
        src = src + k;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
    }
    return;
  }
  __assert_fail("k % QK == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat2.c"
                ,0x357,"void quantize_3(const float *restrict, char *restrict, int, int)");
}

Assistant:

void quantize_3(const float * restrict src, char * restrict dst, int n, int k) {
    assert(k % QK == 0);

    for (int j = 0; j < n; j++) {
        quantize_3_row(src + j*k, dst, k);
        dst = (char *) dst + quantize_3_row_size(k);
    }
}